

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

HashElem * findElementGivenHash(Hash *pH,char *pKey,int nKey,uint h)

{
  uint uVar1;
  Hash *pHVar2;
  uint uVar3;
  uchar uVar4;
  HashElem *pHVar5;
  Hash *pHVar6;
  long lVar7;
  uchar uVar8;
  
  pHVar2 = (Hash *)(pH->ht + h);
  pHVar6 = (Hash *)&pH->count;
  if (pH->ht != (_ht *)0x0) {
    pHVar6 = pHVar2;
    pH = pHVar2;
  }
  uVar1 = pHVar6->htsize;
  if ((uVar1 == 0) || (pHVar5 = pH->first, pHVar5 == (HashElem *)0x0)) {
    return (HashElem *)0x0;
  }
  do {
    if (pHVar5->nKey == nKey) {
      if (nKey < 1) {
        return pHVar5;
      }
      lVar7 = 0;
      uVar3 = nKey + 1;
      while ((ulong)(byte)pHVar5->pKey[lVar7] != 0) {
        uVar4 = ""[(byte)pHVar5->pKey[lVar7]];
        uVar8 = ""[(byte)pKey[lVar7]];
        if (uVar4 != uVar8) goto LAB_00145b00;
        uVar3 = uVar3 - 1;
        lVar7 = lVar7 + 1;
        if (uVar3 < 2) {
          return pHVar5;
        }
      }
      uVar8 = ""[(byte)pKey[lVar7]];
      uVar4 = '\0';
LAB_00145b00:
      if (uVar4 == uVar8) {
        return pHVar5;
      }
    }
    uVar1 = uVar1 - 1;
    if (uVar1 == 0) {
      return (HashElem *)0x0;
    }
    pHVar5 = pHVar5->next;
    if (pHVar5 == (HashElem *)0x0) {
      return (HashElem *)0x0;
    }
  } while( true );
}

Assistant:

static HashElem *findElementGivenHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  int nKey,           /* Bytes in key (not counting zero terminator) */
  unsigned int h      /* The hash for this key. */
){
  HashElem *elem;                /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */

  if( pH->ht ){
    struct _ht *pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    elem = pH->first;
    count = pH->count;
  }
  while( count-- && ALWAYS(elem) ){
    if( elem->nKey==nKey && sqlite3StrNICmp(elem->pKey,pKey,nKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return 0;
}